

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

int ly_out_fd(ly_out *out,int fd)

{
  LY_OUT_TYPE LVar1;
  int iVar2;
  int __fd;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  
  if (out == (ly_out *)0x0) {
    pcVar5 = "out";
  }
  else {
    LVar1 = out->type;
    if (LVar1 < LY_OUT_FILE) {
      iVar2 = *(int *)((long)&out->method + (ulong)(LVar1 == LY_OUT_FDSTREAM) * 8);
      if (fd == -1) {
        return iVar2;
      }
      if (LVar1 != LY_OUT_FDSTREAM) {
        (out->method).fd = fd;
        return iVar2;
      }
      __fd = dup(fd);
      if (__fd < 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
               "Unable to duplicate provided file descriptor (%d) for printing the output (%s).",fd,
               pcVar5);
        return -1;
      }
      pFVar3 = fdopen(__fd,"a");
      if (pFVar3 == (FILE *)0x0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
               "Unable to open provided file descriptor (%d) for printing the output (%s).",fd,
               pcVar5);
        close(__fd);
        return -1;
      }
      fclose((FILE *)(out->method).f);
      (out->method).f = (FILE *)pFVar3;
      (out->method).fdstream.fd = __fd;
      return iVar2;
    }
    pcVar5 = "out->type <= LY_OUT_FDSTREAM";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"ly_out_fd");
  return -1;
}

Assistant:

LIBYANG_API_DEF int
ly_out_fd(struct ly_out *out, int fd)
{
    int prev_fd;

    LY_CHECK_ARG_RET(NULL, out, out->type <= LY_OUT_FDSTREAM, -1);

    if (out->type == LY_OUT_FDSTREAM) {
        prev_fd = out->method.fdstream.fd;
    } else { /* LY_OUT_FD */
        prev_fd = out->method.fd;
    }

    if (fd != -1) {
        /* replace output stream */
        if (out->type == LY_OUT_FDSTREAM) {
            int streamfd;
            FILE *stream;

            streamfd = dup(fd);
            if (streamfd < 0) {
                LOGERR(NULL, LY_ESYS, "Unable to duplicate provided file descriptor (%d) for printing the output (%s).", fd, strerror(errno));
                return -1;
            }
            stream = fdopen(streamfd, "a");
            if (!stream) {
                LOGERR(NULL, LY_ESYS, "Unable to open provided file descriptor (%d) for printing the output (%s).", fd, strerror(errno));
                close(streamfd);
                return -1;
            }
            /* close only the internally created stream, file descriptor is returned and supposed to be closed by the caller */
            fclose(out->method.fdstream.f);
            out->method.fdstream.f = stream;
            out->method.fdstream.fd = streamfd;
        } else { /* LY_OUT_FD */
            out->method.fd = fd;
        }
    }

    return prev_fd;
}